

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9BCore(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  FILE *pFVar4;
  uint uVar5;
  char *pcVar6;
  Bmc_BCorePar_t Pars;
  uint local_78;
  uint local_74;
  undefined8 local_70;
  char *local_68;
  Bmc_BCorePar_t local_58;
  
  local_58.fVerbose = 0;
  local_58._36_4_ = 0;
  local_58.nTimeOut = 0;
  local_58._12_4_ = 0;
  local_58.pFilePivots = (char *)0x0;
  local_58.pFileProof = (char *)0x0;
  local_70 = 0;
  Extra_UtilGetoptReset();
  local_78 = 10;
  local_74 = 0;
  local_68 = (char *)0x0;
  uVar5 = 0;
LAB_002303ed:
  while( true ) {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"FOTVvh"), iVar1 = globalUtilOptind, iVar2 == 0x76) {
      uVar5 = uVar5 ^ 1;
    }
    if (0x4e < iVar2) break;
    if (iVar2 == -1) {
      local_58.fVerbose = uVar5;
      local_58.pFilePivots = local_68;
      local_58.nTimeOut = local_74;
      local_58.iOutput = (int)local_70;
      local_58.iFrame = local_78;
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        pcVar6 = "Abc_CommandAbc9BCore(): There is no AIG.\n";
LAB_0023057e:
        Abc_Print(-1,pcVar6);
        return 0;
      }
      if (pAbc->pGia->nRegs == 0) {
        pcVar6 = "Abc_CommandAbc9BCore(): AIG has no registers.\n";
        goto LAB_0023057e;
      }
      if (local_68 != (char *)0x0) {
        pFVar4 = fopen(local_68,"r");
        if (pFVar4 == (FILE *)0x0) {
          pcVar6 = "Abc_CommandAbc9BCore(): Cannot open file \"%s\" with pivot node IDs.\n";
          goto LAB_002305a1;
        }
        fclose(pFVar4);
      }
      if (globalUtilOptind + 1 == argc) {
        local_68 = argv[globalUtilOptind];
        local_58.pFileProof = local_68;
        pFVar4 = fopen(local_68,"wb");
        if (pFVar4 == (FILE *)0x0) {
          pcVar6 = "Abc_CommandAbc9BCore(): Cannot open file \"%s\" for writing the proof.\n";
LAB_002305a1:
          Abc_Print(-1,pcVar6,local_68);
          return 0;
        }
        fclose(pFVar4);
      }
      Bmc_ManBCorePerform(pAbc->pGia,&local_58);
      return 0;
    }
    if (iVar2 != 0x46) goto LAB_002305e5;
    if (argc <= globalUtilOptind) {
      pcVar6 = "Command line switch \"-F\" should be followed by an integer.\n";
      goto LAB_002305d9;
    }
    local_78 = atoi(argv[globalUtilOptind]);
    uVar3 = local_78;
joined_r0x00230491:
    globalUtilOptind = iVar1 + 1;
    if ((int)uVar3 < 0) {
LAB_002305e5:
      Abc_Print(-2,"usage: &bcore [-FOTV num] [-vh] <file>\n");
      Abc_Print(-2,"\t         records UNSAT core of the BMC instance\n");
      Abc_Print(-2,"\t-F num : the zero-based index of a timeframe [default = %d]\n",(ulong)local_78
               );
      Abc_Print(-2,"\t-O num : the zero-based index of a primary output [default = %d]\n",local_70);
      Abc_Print(-2,"\t-T num : approximate timeout in seconds [default = %d]\n",(ulong)local_74);
      Abc_Print(-2,"\t-V file: file name with AIG IDs of pivot variables [default = no pivots]\n");
      pcVar6 = "yes";
      if (uVar5 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar6);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\t<file> : file name to write the resulting proof [default = stdout]\n");
      return 1;
    }
  }
  if (iVar2 == 0x4f) {
    if (globalUtilOptind < argc) {
      uVar3 = atoi(argv[globalUtilOptind]);
      local_70 = CONCAT44(extraout_var,uVar3);
      goto joined_r0x00230491;
    }
    pcVar6 = "Command line switch \"-O\" should be followed by an integer.\n";
  }
  else if (iVar2 == 0x54) {
    if (globalUtilOptind < argc) {
      local_74 = atoi(argv[globalUtilOptind]);
      uVar3 = local_74;
      goto joined_r0x00230491;
    }
    pcVar6 = "Command line switch \"-T\" should be followed by an integer.\n";
  }
  else {
    if (iVar2 != 0x56) goto LAB_002305e5;
    if (globalUtilOptind < argc) {
      local_68 = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_002303ed;
    }
    pcVar6 = "Command line switch \"-V\" should be followed by a file name.\n";
  }
LAB_002305d9:
  Abc_Print(-1,pcVar6);
  goto LAB_002305e5;
}

Assistant:

int Abc_CommandAbc9BCore( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c;
    Bmc_BCorePar_t Pars, * pPars = &Pars;
    memset( pPars, 0, sizeof(Bmc_BCorePar_t) );
    pPars->iFrame        =   10;  // timeframe
    pPars->iOutput       =    0;  // property output
    pPars->nTimeOut      =    0;  // timeout in seconds
    pPars->pFilePivots   = NULL;  // file name with AIG IDs of pivot objects
    pPars->pFileProof    = NULL;  // file name to write the resulting proof
    pPars->fVerbose      =    0;  // verbose output
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FOTVvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->iFrame = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->iFrame < 0 )
                goto usage;
            break;
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->iOutput = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->iOutput < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOut < 0 )
                goto usage;
            break;
        case 'V':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-V\" should be followed by a file name.\n" );
                goto usage;
            }
            pPars->pFilePivots = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9BCore(): There is no AIG.\n" );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9BCore(): AIG has no registers.\n" );
        return 0;
    }
    // get the file name
    if ( pPars->pFilePivots != NULL )
    {
        FILE * pFile;
        pFile = fopen( pPars->pFilePivots, "r" );
        if ( pFile == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9BCore(): Cannot open file \"%s\" with pivot node IDs.\n", pPars->pFilePivots );
            return 0;
        }
        fclose( pFile );
    }
    // get the file name
    if ( argc == globalUtilOptind + 1 )
    {
        FILE * pFile;
        pPars->pFileProof = argv[globalUtilOptind];
        pFile = fopen( pPars->pFileProof, "wb" );
        if ( pFile == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9BCore(): Cannot open file \"%s\" for writing the proof.\n", pPars->pFileProof );
            return 0;
        }
        fclose( pFile );
    }
    Bmc_ManBCorePerform( pAbc->pGia, pPars );
    return 0;

usage:
    Abc_Print( -2, "usage: &bcore [-FOTV num] [-vh] <file>\n" );
    Abc_Print( -2, "\t         records UNSAT core of the BMC instance\n" );
    Abc_Print( -2, "\t-F num : the zero-based index of a timeframe [default = %d]\n",         pPars->iFrame );
    Abc_Print( -2, "\t-O num : the zero-based index of a primary output [default = %d]\n",    pPars->iOutput );
    Abc_Print( -2, "\t-T num : approximate timeout in seconds [default = %d]\n",              pPars->nTimeOut );
    Abc_Print( -2, "\t-V file: file name with AIG IDs of pivot variables [default = no pivots]\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",         pPars->fVerbose?     "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : file name to write the resulting proof [default = stdout]\n");
    return 1;
}